

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O0

size_t ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp *ws,ZSTD_cwksp_alloc_phase_e phase)

{
  void *pvVar1;
  size_t sVar2;
  void *objectEnd;
  size_t bytesToAlign;
  void *alloc;
  ZSTD_cwksp_alloc_phase_e phase_local;
  ZSTD_cwksp *ws_local;
  
  if (phase < ws->phase) {
    __assert_fail("phase >= ws->phase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                  ,0x13b,
                  "size_t ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp *, ZSTD_cwksp_alloc_phase_e)"
                 );
  }
  if (ws->phase < phase) {
    if ((ws->phase == ZSTD_cwksp_alloc_objects) && (phase != ZSTD_cwksp_alloc_objects)) {
      ws->tableValidEnd = ws->objectEnd;
      pvVar1 = ZSTD_cwksp_initialAllocStart(ws);
      ws->initOnceStart = pvVar1;
      pvVar1 = ws->objectEnd;
      sVar2 = ZSTD_cwksp_bytes_to_align_ptr(pvVar1,0x40);
      pvVar1 = (void *)((long)pvVar1 + sVar2);
      if (ws->workspaceEnd < pvVar1) {
        return 0xffffffffffffffc0;
      }
      ws->objectEnd = pvVar1;
      ws->tableEnd = pvVar1;
      if (ws->tableValidEnd < ws->tableEnd) {
        ws->tableValidEnd = ws->tableEnd;
      }
    }
    ws->phase = phase;
    ZSTD_cwksp_assert_internal_consistency(ws);
  }
  return 0;
}

Assistant:

MEM_STATIC size_t
ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp* ws, ZSTD_cwksp_alloc_phase_e phase)
{
    assert(phase >= ws->phase);
    if (phase > ws->phase) {
        /* Going from allocating objects to allocating initOnce / tables */
        if (ws->phase < ZSTD_cwksp_alloc_aligned_init_once &&
            phase >= ZSTD_cwksp_alloc_aligned_init_once) {
            ws->tableValidEnd = ws->objectEnd;
            ws->initOnceStart = ZSTD_cwksp_initialAllocStart(ws);

            {   /* Align the start of the tables to 64 bytes. Use [0, 63] bytes */
                void *const alloc = ws->objectEnd;
                size_t const bytesToAlign = ZSTD_cwksp_bytes_to_align_ptr(alloc, ZSTD_CWKSP_ALIGNMENT_BYTES);
                void *const objectEnd = (BYTE *) alloc + bytesToAlign;
                DEBUGLOG(5, "reserving table alignment addtl space: %zu", bytesToAlign);
                RETURN_ERROR_IF(objectEnd > ws->workspaceEnd, memory_allocation,
                                "table phase - alignment initial allocation failed!");
                ws->objectEnd = objectEnd;
                ws->tableEnd = objectEnd;  /* table area starts being empty */
                if (ws->tableValidEnd < ws->tableEnd) {
                    ws->tableValidEnd = ws->tableEnd;
                }
            }
        }
        ws->phase = phase;
        ZSTD_cwksp_assert_internal_consistency(ws);
    }
    return 0;
}